

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void rw::decompressDXT5(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32 *puVar9;
  uint8 *puVar10;
  ulong uVar11;
  int iVar12;
  int32 k;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint32 *puVar16;
  uint32 k_2;
  long lVar17;
  ulong uVar18;
  uint8 aidx [16];
  uint8 idx [16];
  uint local_d8 [4];
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8 [4];
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  undefined8 local_88;
  uint local_80;
  uint32 a [8];
  uint32 c [4] [4];
  
  if (0 < h * w) {
    uVar6 = (ulong)(uint)(h * w);
    a[2] = (int)uVar6;
    a[3] = (int)(uVar6 >> 0x20);
    uVar11 = 0;
    iVar12 = 0;
    uVar7 = 0;
    a._0_8_ = src;
    puVar10 = src;
    do {
      a[4] = (int)uVar7;
      a[5] = (int)(uVar7 >> 0x20);
      uVar3 = *(ushort *)(puVar10 + uVar11 + 8);
      uVar4 = *(ushort *)(puVar10 + uVar11 + 10);
      local_b8[0] = ((uint)(uVar3 >> 0xb) * 0xff) / 0x1f;
      local_b8[1] = ((uVar3 >> 5 & 0x3f) * 0xff) / 0x3f;
      local_b8[2] = ((uVar3 & 0x1f) * 0xff) / 0x1f;
      local_a8 = ((uint)(uVar4 >> 0xb) * 0xff) / 0x1f;
      local_a4 = ((uVar4 >> 5 & 0x3f) * 0xff) / 0x3f;
      local_a0 = ((uVar4 & 0x1f) * 0xff) / 0x1f;
      if (uVar4 < uVar3) {
        local_98 = (local_a8 + local_b8[0] * 2) / 3;
        local_94 = (local_a4 + local_b8[1] * 2) / 3;
        local_90 = (local_a0 + local_b8[2] * 2) / 3;
        local_88 = CONCAT44((local_b8[1] + local_a4 * 2) / 3,(local_b8[0] + local_a8 * 2) / 3);
        local_80 = (local_b8[2] + local_a0 * 2) / 3;
      }
      else {
        local_98 = local_a8 + local_b8[0] >> 1;
        local_94 = local_a4 + local_b8[1] >> 1;
        local_90 = local_a0 + local_b8[2] >> 1;
        local_88 = 0;
        local_80 = 0;
      }
      bVar1 = src[uVar11];
      uVar5 = (uint)bVar1;
      local_d8[0] = (uint)bVar1;
      bVar2 = src[uVar11 + 1];
      uVar15 = (uint)bVar2;
      local_d8[1] = (uint)bVar2;
      if (bVar2 < bVar1) {
        local_d8[2] = (uVar15 + uVar5 * 6) / 7;
        local_d8[3] = ((uint)bVar2 + (uint)bVar2 + uVar5 * 5) / 7;
        local_c8 = (uVar15 * 3 + uVar5 * 4) / 7;
        local_c4 = (uVar5 * 3 + uVar15 * 4) / 7;
        local_c0 = (uVar15 * 5 + uVar5 * 2) / 7;
        local_bc = (uVar5 + uVar15 * 6) / 7;
      }
      else {
        local_d8[2] = (uVar15 + uVar5 * 4) / 5;
        local_d8[3] = ((uint)bVar2 + (uint)bVar2 + uVar5 * 3) / 5;
        local_c8 = (uVar15 * 3 + uVar5 * 2) / 5;
        local_c4 = (uVar5 + uVar15 * 4) / 5;
        local_c0 = 0;
        local_bc = 0xff;
      }
      uVar5 = *(uint *)(src + uVar11 + 0xc);
      lVar14 = 0;
      do {
        *(byte *)((long)c[0] + lVar14 + 8) = (byte)uVar5 & 3;
        uVar5 = uVar5 >> 2;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x10);
      uVar8 = *(ulong *)(src + uVar11 + 2);
      lVar14 = 0;
      do {
        *(byte *)((long)a + lVar14 + 0x18) = (byte)uVar8 & 7;
        uVar8 = uVar8 >> 3;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x10);
      iVar13 = w * (int)uVar7 + iVar12;
      puVar9 = a + 6;
      puVar16 = c[0] + 2;
      lVar14 = 0;
      do {
        lVar17 = 0;
        do {
          uVar8 = (ulong)*(byte *)((long)puVar16 + lVar17);
          uVar18 = (ulong)(uint)(iVar13 + (int)lVar17);
          adst[uVar18 * 4] = (uint8)local_b8[uVar8 * 4];
          adst[uVar18 * 4 + 1] = (uint8)local_b8[uVar8 * 4 + 1];
          adst[uVar18 * 4 + 2] = (uint8)local_b8[uVar8 * 4 + 2];
          adst[uVar18 * 4 + 3] = (uint8)local_d8[*(byte *)((long)puVar9 + lVar17)];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        lVar14 = lVar14 + 1;
        iVar13 = iVar13 + w;
        puVar16 = puVar16 + 1;
        puVar9 = puVar9 + 1;
      } while (lVar14 != 4);
      iVar12 = iVar12 + 4;
      if (w <= iVar12) {
        iVar12 = 0;
        uVar7 = (ulong)((int)uVar7 + 4);
      }
      uVar11 = uVar11 + 0x10;
      puVar10 = (uint8 *)a._0_8_;
    } while (uVar11 < uVar6);
  }
  return;
}

Assistant:

void
decompressDXT5(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint32 a[8];
	uint8 idx[16];
	uint8 aidx[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h; j += 16){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+8]);
		uint32 col1 = *((uint16*)&src[j+10]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;
		if(col0 > col1){
			c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
			c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
			c[2][2] = (2*c[0][2] + 1*c[1][2])/3;

			c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
			c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
			c[3][2] = (1*c[0][2] + 2*c[1][2])/3;
		}else{
			c[2][0] = (c[0][0] + c[1][0])/2;
			c[2][1] = (c[0][1] + c[1][1])/2;
			c[2][2] = (c[0][2] + c[1][2])/2;

			c[3][0] = 0x00;
			c[3][1] = 0x00;
			c[3][2] = 0x00;
		}

		a[0] = src[j+0];
		a[1] = src[j+1];
		if(a[0] > a[1]){
			a[2] = (6*a[0] + 1*a[1])/7;
			a[3] = (5*a[0] + 2*a[1])/7;
			a[4] = (4*a[0] + 3*a[1])/7;
			a[5] = (3*a[0] + 4*a[1])/7;
			a[6] = (2*a[0] + 5*a[1])/7;
			a[7] = (1*a[0] + 6*a[1])/7;
		}else{
			a[2] = (4*a[0] + 1*a[1])/5;
			a[3] = (3*a[0] + 2*a[1])/5;
			a[4] = (2*a[0] + 3*a[1])/5;
			a[5] = (1*a[0] + 4*a[1])/5;
			a[6] = 0;
			a[7] = 0xFF;
		}

		/* make index list */
		uint32 indices = *((uint32*)&src[j+12]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}
		// only 6 indices
		uint64 alphas = *((uint64*)&src[j+2]);
		for(int32 k = 0; k < 16; k++){
			aidx[k] = alphas & 0x7;
			alphas >>= 3;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = a[aidx[l*4+k]];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}